

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_lower_bound(OSQPWorkspace *work,c_float *l_new)

{
  c_float *b;
  OSQPData *pOVar1;
  c_int cVar2;
  long lVar3;
  c_float cVar4;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar2 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_lower_bound");
    return cVar2;
  }
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer);
  prea_vec_copy(l_new,work->data->l,work->data->m);
  if (work->settings->scaling != 0) {
    b = work->data->l;
    vec_ew_prod(work->scaling->E,b,b,work->data->m);
  }
  pOVar1 = work->data;
  if (0 < pOVar1->m) {
    lVar3 = 0;
    do {
      if (pOVar1->u[lVar3] <= pOVar1->l[lVar3] && pOVar1->l[lVar3] != pOVar1->u[lVar3]) {
        printf("ERROR in %s: ","osqp_update_lower_bound");
        printf("upper bound must be greater than or equal to lower bound");
        putchar(10);
        return 1;
      }
      lVar3 = lVar3 + 1;
    } while (pOVar1->m != lVar3);
  }
  reset_info(work->info);
  cVar2 = update_rho_vec(work);
  cVar4 = osqp_toc(work->timer);
  work->info->update_time = cVar4 + work->info->update_time;
  return cVar2;
}

Assistant:

c_int osqp_update_lower_bound(OSQPWorkspace *work, const c_float *l_new) {
  c_int i, exitflag = 0;

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Replace l by the new vector
  prea_vec_copy(l_new, work->data->l, work->data->m);

  // Scaling
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->E, work->data->l, work->data->l, work->data->m);
  }

  // Check if lower bound is smaller than upper bound
  for (i = 0; i < work->data->m; i++) {
    if (work->data->l[i] > work->data->u[i]) {
#ifdef PRINTING
      c_eprint("upper bound must be greater than or equal to lower bound");
#endif /* ifdef PRINTING */
      return 1;
    }
  }

  // Reset solver information
  reset_info(work->info);

#if EMBEDDED != 1
  // Update rho_vec and refactor if constraints type changes
  exitflag = update_rho_vec(work);
#endif // EMBEDDED ! =1

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}